

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_currencysymbols.cpp
# Opt level: O0

CurrencyUnit *
icu_63::number::impl::resolveCurrency
          (CurrencyUnit *__return_storage_ptr__,DecimalFormatProperties *properties,Locale *locale,
          UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  char *locale_00;
  ConstChar16Ptr local_40;
  UChar local_34 [4];
  char16_t buf [4];
  UErrorCode localStatus;
  UErrorCode *status_local;
  Locale *locale_local;
  DecimalFormatProperties *properties_local;
  
  unique0x10000103 = status;
  bVar1 = NullableValue<icu_63::CurrencyUnit>::isNull(&properties->currency);
  if (bVar1) {
    buf[0] = L'\0';
    buf[1] = L'\0';
    memset(local_34,0,8);
    locale_00 = Locale::getName(locale);
    ucurr_forLocale_63(locale_00,local_34,4,(UErrorCode *)buf);
    UVar2 = ::U_SUCCESS(buf._0_4_);
    if (UVar2 == '\0') {
      CurrencyUnit::CurrencyUnit(__return_storage_ptr__);
    }
    else {
      ConstChar16Ptr::ConstChar16Ptr(&local_40,local_34);
      CurrencyUnit::CurrencyUnit(__return_storage_ptr__,&local_40,stack0xffffffffffffffd8);
      ConstChar16Ptr::~ConstChar16Ptr(&local_40);
    }
  }
  else {
    NullableValue<icu_63::CurrencyUnit>::getNoError(__return_storage_ptr__,&properties->currency);
  }
  return __return_storage_ptr__;
}

Assistant:

CurrencyUnit
icu::number::impl::resolveCurrency(const DecimalFormatProperties& properties, const Locale& locale,
                                   UErrorCode& status) {
    if (!properties.currency.isNull()) {
        return properties.currency.getNoError();
    } else {
        UErrorCode localStatus = U_ZERO_ERROR;
        char16_t buf[4] = {};
        ucurr_forLocale(locale.getName(), buf, 4, &localStatus);
        if (U_SUCCESS(localStatus)) {
            return CurrencyUnit(buf, status);
        } else {
            // Default currency (XXX)
            return CurrencyUnit();
        }
    }
}